

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

void lua_resetthread(lua_State *L,lua_State *th)

{
  uint uVar1;
  uint64_t uVar2;
  void *pvVar3;
  TValue *level;
  
  th->dummy_ffid = '\x01';
  th->status = '\0';
  (th->glref).ptr64 = (L->glref).ptr64;
  (th->env).gcptr64 = (L->env).gcptr64;
  th->cframe = (void *)0x0;
  uVar2 = (th->stack).ptr64;
  if (uVar2 != 0) {
    lj_state_relimitstack(th);
    uVar1 = th->stacksize;
    level = (TValue *)(uVar2 + 0x10);
    th->top = level;
    th->base = level;
    lj_func_closeuv(L,level);
    for (; level < (TValue *)(uVar2 + (ulong)uVar1 * 8); level = level + 1) {
      level->u64 = 0xffffffffffffffff;
    }
  }
  pvVar3 = L->exdata2;
  th->exdata = L->exdata;
  th->exdata2 = pvVar3;
  return;
}

Assistant:

LUA_API void lua_resetthread(lua_State *L, lua_State *th)
{
  TValue *stend, *st;

  th->dummy_ffid = FF_C;
  th->status = LUA_OK;

  setmrefr(th->glref, L->glref);
  setgcrefr(th->env, L->env);

  th->cframe = NULL;

  st = tvref(th->stack);

  if (st != NULL) {
    lj_state_relimitstack(th);

    stend = st + th->stacksize;
    st++; /* Needed for curr_funcisL() on empty stack. */
    if (LJ_FR2) st++;
    th->base = th->top = st;
    lj_func_closeuv(L, st);
    while (st < stend)  /* Clear new slots. */
      setnilV(st++);
  }

  th->exdata = L->exdata;
  th->exdata2 = L->exdata2;
}